

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O3

int mk_plugin_http_request_end(mk_plugin *plugin,mk_http_session *cs,int close)

{
  mk_server *server;
  mk_list *pmVar1;
  mk_sched_conn *conn;
  uint uVar2;
  mk_sched_worker *sched;
  mk_list *pmVar3;
  
  server = plugin->server_ctx;
  cs->status = -1;
  if ((cs->request_list).next == &cs->request_list) {
    uVar2 = 0xffffffff;
  }
  else {
    pmVar3 = (server->stage40_handler).next;
    if (pmVar3 != &server->stage40_handler) {
      pmVar1 = (cs->request_list).prev;
      do {
        (*(code *)pmVar3[-2].next)(cs,&pmVar1[-0x3f].next);
        pmVar3 = pmVar3->next;
      } while (pmVar3 != &server->stage40_handler);
    }
    if (close == 1) {
      cs->close_now = 1;
    }
    uVar2 = mk_http_request_end(cs,server);
    if ((int)uVar2 < 0) {
      conn = cs->conn;
      sched = (mk_sched_worker *)pthread_getspecific(mk_tls_sched_worker_node);
      uVar2 = mk_sched_event_close(conn,sched,3,server);
      uVar2 = -(uint)(uVar2 == 0) | uVar2;
    }
  }
  return uVar2;
}

Assistant:

int mk_plugin_http_request_end(struct mk_plugin *plugin,
                               struct mk_http_session *cs, int close)
{
    int ret;
    int con;
    struct mk_http_request *sr;
    struct mk_server *server = plugin->server_ctx;

    MK_TRACE("[FD %i] PLUGIN HTTP REQUEST END", cs->socket);

    cs->status = MK_REQUEST_STATUS_INCOMPLETE;
    if (mk_list_is_empty(&cs->request_list) == 0) {
        MK_TRACE("[FD %i] Tried to end non-existing request.", cs->socket);
        return -1;
    }

    sr = mk_list_entry_last(&cs->request_list, struct mk_http_request, _head);
    mk_plugin_stage_run_40(cs, sr, server);

    if (close == MK_TRUE) {
        cs->close_now = MK_TRUE;
    }

    /* Let's check if we should ask to finalize the connection or not */
    ret = mk_http_request_end(cs, server);
    MK_TRACE("[FD %i] HTTP session end = %i", cs->socket, ret);
    if (ret < 0) {
        con = mk_sched_event_close(cs->conn, mk_sched_get_thread_conf(),
                                   MK_EP_SOCKET_DONE, server);
        if (con != 0) {
            return con;
        }
        else {
            return -1;
        }
    }

    return ret;
}